

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_parse_point.cpp
# Opt level: O2

int ON_ParsePointExpression
              (wchar_t *str,int str_count,ON_ParseSettings parse_settings,
              LengthUnitSystem point_value_unit_system,ON_3dPoint *point_value,
              ON_ParseSettings *parse_results)

{
  wchar_t *str_00;
  double dVar1;
  ON_ParseSettings parse_settings_00;
  ON_ParseSettings parse_settings_01;
  ON_ParseSettings parse_settings_02;
  ON_ParseSettings parse_settings_03;
  ON__UINT32 aOVar2 [2];
  ON__UINT32 aOVar3 [2];
  ON__UINT16 OVar4;
  ON__UINT8 OVar5;
  ON__UINT8 OVar6;
  ON__UINT64 OVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  ON_ParseSettings *pOVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  ON_2dVector OVar19;
  uint local_128;
  double y;
  double x;
  ON_3dPoint *local_110;
  double spherical_angle;
  double z;
  double local_f8;
  ON_ParseSettings *local_f0;
  ON_ParseSettings pry;
  ON_ParseSettings prz;
  ON_ParseSettings prx;
  ON_ParseSettings local_70;
  ON_ParseSettings local_50;
  
  z = 0.0;
  x = -1.23432101234321e+308;
  y = -1.23432101234321e+308;
  spherical_angle = -1.23432101234321e+308;
  if (point_value != (ON_3dPoint *)0x0) {
    point_value->z = ON_3dPoint::Origin.z;
    dVar1 = ON_3dPoint::Origin.y;
    point_value->x = ON_3dPoint::Origin.x;
    point_value->y = dVar1;
  }
  OVar7 = ON_ParseSettings::FalseSettings.m_reserved;
  aOVar3 = ON_ParseSettings::FalseSettings.m_false_default_bits;
  aOVar2 = ON_ParseSettings::FalseSettings.m_true_default_bits;
  if (parse_results != (ON_ParseSettings *)0x0) {
    OVar4 = ON_ParseSettings::FalseSettings.m_context_locale_id;
    OVar5 = ON_ParseSettings::FalseSettings.m_context_angle_unit_system;
    OVar6 = ON_ParseSettings::FalseSettings.m_context_length_unit_system;
    parse_results->m_reserved_bits = ON_ParseSettings::FalseSettings.m_reserved_bits;
    parse_results->m_context_locale_id = OVar4;
    parse_results->m_context_angle_unit_system = OVar5;
    parse_results->m_context_length_unit_system = OVar6;
    parse_results->m_reserved = OVar7;
    *&parse_results->m_true_default_bits = aOVar2;
    *&parse_results->m_false_default_bits = aOVar3;
  }
  prx.m_reserved_bits = ON_ParseSettings::FalseSettings.m_reserved_bits;
  prx.m_context_locale_id = ON_ParseSettings::FalseSettings.m_context_locale_id;
  prx.m_context_angle_unit_system = ON_ParseSettings::FalseSettings.m_context_angle_unit_system;
  prx.m_context_length_unit_system = ON_ParseSettings::FalseSettings.m_context_length_unit_system;
  prx.m_reserved = ON_ParseSettings::FalseSettings.m_reserved;
  prx.m_true_default_bits[0] = ON_ParseSettings::FalseSettings.m_true_default_bits[0];
  prx.m_true_default_bits[1] = ON_ParseSettings::FalseSettings.m_true_default_bits[1];
  prx.m_false_default_bits[0] = ON_ParseSettings::FalseSettings.m_false_default_bits[0];
  prx.m_false_default_bits[1] = ON_ParseSettings::FalseSettings.m_false_default_bits[1];
  pry.m_reserved_bits = ON_ParseSettings::FalseSettings.m_reserved_bits;
  pry.m_context_locale_id = ON_ParseSettings::FalseSettings.m_context_locale_id;
  pry.m_context_angle_unit_system = ON_ParseSettings::FalseSettings.m_context_angle_unit_system;
  pry.m_context_length_unit_system = ON_ParseSettings::FalseSettings.m_context_length_unit_system;
  pry.m_reserved = ON_ParseSettings::FalseSettings.m_reserved;
  pry.m_true_default_bits[0] = ON_ParseSettings::FalseSettings.m_true_default_bits[0];
  pry.m_true_default_bits[1] = ON_ParseSettings::FalseSettings.m_true_default_bits[1];
  pry.m_false_default_bits[0] = ON_ParseSettings::FalseSettings.m_false_default_bits[0];
  pry.m_false_default_bits[1] = ON_ParseSettings::FalseSettings.m_false_default_bits[1];
  prz.m_reserved_bits = ON_ParseSettings::FalseSettings.m_reserved_bits;
  prz.m_context_locale_id = ON_ParseSettings::FalseSettings.m_context_locale_id;
  prz.m_context_angle_unit_system = ON_ParseSettings::FalseSettings.m_context_angle_unit_system;
  prz.m_context_length_unit_system = ON_ParseSettings::FalseSettings.m_context_length_unit_system;
  prz.m_reserved = ON_ParseSettings::FalseSettings.m_reserved;
  prz.m_true_default_bits[0] = ON_ParseSettings::FalseSettings.m_true_default_bits[0];
  prz.m_true_default_bits[1] = ON_ParseSettings::FalseSettings.m_true_default_bits[1];
  prz.m_false_default_bits[0] = ON_ParseSettings::FalseSettings.m_false_default_bits[0];
  prz.m_false_default_bits[1] = ON_ParseSettings::FalseSettings.m_false_default_bits[1];
  uVar12 = 0x7ffffffd;
  if (str_count != -1) {
    uVar12 = str_count;
  }
  local_f0 = parse_results;
  if ((int)uVar12 < 1) {
LAB_005740b1:
    local_128 = 0;
  }
  else {
    local_110 = point_value;
    bVar8 = ON_ParseSettings::ParseLeadingWhiteSpace(&parse_settings);
    local_128 = 0;
    uVar16 = 0;
    if (bVar8) {
      for (uVar16 = 0; uVar12 != uVar16; uVar16 = uVar16 + 1) {
        bVar8 = ON_ParseSettings::IsLeadingWhiteSpace(&parse_settings,str[uVar16]);
        if (!bVar8) {
          ON_ParseSettings::SetParseLeadingWhiteSpace(&parse_settings,false);
          goto LAB_00573df0;
        }
      }
      goto LAB_005740b1;
    }
LAB_00573df0:
    iVar11 = (int)uVar16;
    str_00 = str + (uVar16 & 0xffffffff);
    parse_settings_00.m_false_default_bits[0] = parse_settings.m_false_default_bits[0];
    parse_settings_00.m_false_default_bits[1] = parse_settings.m_false_default_bits[1];
    parse_settings_00.m_true_default_bits[0] = parse_settings.m_true_default_bits[0];
    parse_settings_00.m_true_default_bits[1] = parse_settings.m_true_default_bits[1];
    parse_settings_00.m_reserved_bits = parse_settings.m_reserved_bits;
    parse_settings_00.m_context_locale_id = parse_settings.m_context_locale_id;
    parse_settings_00.m_context_angle_unit_system = parse_settings.m_context_angle_unit_system;
    parse_settings_00.m_context_length_unit_system = parse_settings.m_context_length_unit_system;
    parse_settings_00.m_reserved = parse_settings.m_reserved;
    iVar9 = ON_ParseLengthExpression
                      (str_00,uVar12 - iVar11,parse_settings_00,point_value_unit_system,&x,&prx,
                       (LengthUnitSystem *)0x0);
    if (0 < iVar9) {
      uVar14 = iVar9 + iVar11;
      if ((((iVar9 == 1 && uVar14 == uVar12) && (*str_00 == L'0')) && (x == 0.0)) && (!NAN(x))) {
        y = 0.0;
        z = 0.0;
        local_128 = uVar12 + iVar11;
        goto LAB_00573e7b;
      }
      if ((int)uVar14 < (int)uVar12) {
        uVar15 = uVar14;
        if ((((int)(uVar14 + 2) <= (int)uVar12) && (str[uVar14] == L',')) &&
           (uVar15 = uVar14 + 1, str[(ulong)uVar14 + 1] != L'<')) {
          uVar15 = uVar14;
        }
        if (str[(int)uVar15] == L',') {
          if (((iVar11 + 1U == uVar15) && (*str_00 == L'0')) && ((x == 0.0 && (!NAN(x))))) {
            y = 0.0;
            pry.m_true_default_bits[0] = ON_ParseSettings::FalseSettings.m_true_default_bits[0];
            pry.m_true_default_bits[1] = ON_ParseSettings::FalseSettings.m_true_default_bits[1];
            pry.m_false_default_bits[0] = ON_ParseSettings::FalseSettings.m_false_default_bits[0];
            pry.m_false_default_bits[1] = ON_ParseSettings::FalseSettings.m_false_default_bits[1];
            pry.m_reserved_bits = ON_ParseSettings::FalseSettings.m_reserved_bits;
            pry.m_context_locale_id = ON_ParseSettings::FalseSettings.m_context_locale_id;
            pry.m_context_angle_unit_system =
                 ON_ParseSettings::FalseSettings.m_context_angle_unit_system;
            pry.m_context_length_unit_system =
                 ON_ParseSettings::FalseSettings.m_context_length_unit_system;
            pry.m_reserved = ON_ParseSettings::FalseSettings.m_reserved;
            local_128 = uVar15;
            goto LAB_00573e7b;
          }
        }
        else {
          iVar9 = uVar15 + 1;
          if (uVar12 - iVar9 != 0 && iVar9 <= (int)uVar12) {
            local_128 = 0;
            parse_settings_01.m_false_default_bits[0] = parse_settings.m_false_default_bits[0];
            parse_settings_01.m_false_default_bits[1] = parse_settings.m_false_default_bits[1];
            parse_settings_01.m_true_default_bits[0] = parse_settings.m_true_default_bits[0];
            parse_settings_01.m_true_default_bits[1] = parse_settings.m_true_default_bits[1];
            parse_settings_01.m_reserved_bits = parse_settings.m_reserved_bits;
            parse_settings_01.m_context_locale_id = parse_settings.m_context_locale_id;
            parse_settings_01.m_context_angle_unit_system =
                 parse_settings.m_context_angle_unit_system;
            parse_settings_01.m_context_length_unit_system =
                 parse_settings.m_context_length_unit_system;
            parse_settings_01.m_reserved = parse_settings.m_reserved;
            iVar10 = ON_ParseLengthExpression
                               (str + iVar9,uVar12 - iVar9,parse_settings_01,point_value_unit_system
                                ,&y,&pry,(LengthUnitSystem *)0x0);
            if ((iVar10 < 1) || ((int)uVar12 < iVar11 + iVar9)) {
              if (iVar10 < 1) goto LAB_005740ba;
              uVar17 = 0x9e331dd2;
              uVar18 = 0xffe5f8bd;
            }
            else {
              bVar8 = ON_IsValid(x);
              uVar17 = 0x9e331dd2;
              uVar18 = 0xffe5f8bd;
              if (bVar8) {
                bVar8 = ON_IsValid(y);
                uVar17 = 0x9e331dd2;
                uVar18 = 0xffe5f8bd;
                if (bVar8) {
                  ON_2dVector::ON_2dVector((ON_2dVector *)&local_70,x,y);
                  dVar1 = ON_2dVector::Length((ON_2dVector *)&local_70);
                  uVar17 = SUB84(dVar1,0);
                  uVar18 = (undefined4)((ulong)dVar1 >> 0x20);
                }
              }
            }
            local_128 = iVar10 + iVar9;
            if ((int)local_128 < (int)uVar12) {
              uVar14 = local_128;
              if ((((int)(local_128 + 2) <= (int)uVar12) && (str[(int)local_128] == L',')) &&
                 (uVar14 = local_128 + 1, str[(long)(int)local_128 + 1] != L'<')) {
                uVar14 = local_128;
              }
              if (str[(int)uVar14] == L'<') {
                local_f8 = (double)CONCAT44(uVar18,uVar17);
                local_128 = 0;
                parse_settings_03.m_false_default_bits[0] = parse_settings.m_false_default_bits[0];
                parse_settings_03.m_false_default_bits[1] = parse_settings.m_false_default_bits[1];
                parse_settings_03.m_true_default_bits[0] = parse_settings.m_true_default_bits[0];
                parse_settings_03.m_true_default_bits[1] = parse_settings.m_true_default_bits[1];
                parse_settings_03.m_reserved_bits = parse_settings.m_reserved_bits;
                parse_settings_03.m_context_locale_id = parse_settings.m_context_locale_id;
                parse_settings_03.m_context_angle_unit_system =
                     parse_settings.m_context_angle_unit_system;
                parse_settings_03.m_context_length_unit_system =
                     parse_settings.m_context_length_unit_system;
                parse_settings_03.m_reserved = parse_settings.m_reserved;
                iVar9 = ON_ParseAngleExpression
                                  (str + (int)uVar14,uVar12 - uVar14,parse_settings_03,Radians,
                                   &spherical_angle,&prz,(AngleUnitSystem *)0x0);
                uVar14 = uVar14 + iVar9;
                if ((((int)uVar14 <= (int)uVar12 && 0 < iVar9) &&
                    (bVar8 = ON_IsValid(spherical_angle), bVar8)) &&
                   ((bVar8 = ON_IsValid(local_f8), 0.0 <= local_f8 && bVar8 &&
                    (OVar19 = CosineAndSine(spherical_angle), 0.0 < OVar19.x)))) {
                  dVar1 = tan(spherical_angle);
                  bVar8 = ON_IsValid(dVar1);
                  if (bVar8) {
                    z = local_f8 * dVar1;
LAB_005740a0:
                    local_128 = uVar14;
                    if ((int)uVar12 < (int)uVar14) goto LAB_005740b1;
                    goto LAB_00573e7b;
                  }
                }
              }
              else {
                local_128 = uVar14;
                if (str[(int)uVar14] != L',') goto LAB_00573e7b;
                iVar9 = uVar14 + 1;
                if (uVar12 - iVar9 == 0 || (int)uVar12 < iVar9) goto LAB_005740b1;
                local_128 = 0;
                parse_settings_02.m_false_default_bits[0] = parse_settings.m_false_default_bits[0];
                parse_settings_02.m_false_default_bits[1] = parse_settings.m_false_default_bits[1];
                parse_settings_02.m_true_default_bits[0] = parse_settings.m_true_default_bits[0];
                parse_settings_02.m_true_default_bits[1] = parse_settings.m_true_default_bits[1];
                parse_settings_02.m_reserved_bits = parse_settings.m_reserved_bits;
                parse_settings_02.m_context_locale_id = parse_settings.m_context_locale_id;
                parse_settings_02.m_context_angle_unit_system =
                     parse_settings.m_context_angle_unit_system;
                parse_settings_02.m_context_length_unit_system =
                     parse_settings.m_context_length_unit_system;
                parse_settings_02.m_reserved = parse_settings.m_reserved;
                iVar11 = ON_ParseLengthExpression
                                   (str + iVar9,uVar12 - iVar9,parse_settings_02,
                                    point_value_unit_system,&z,&prz,(LengthUnitSystem *)0x0);
                if (0 < iVar11) {
                  uVar14 = iVar9 + iVar11;
                  goto LAB_005740a0;
                }
              }
            }
            else {
LAB_00573e7b:
              if (0 < (int)local_128) {
                pOVar13 = local_f0;
                if (local_110 != (ON_3dPoint *)0x0) {
                  local_110->x = x;
                  local_110->y = y;
                  local_110->z = z;
                }
                goto LAB_00574140;
              }
            }
          }
        }
      }
    }
  }
LAB_005740ba:
  bVar8 = ON_ParseSettings::ParseError(&prx);
  if (!bVar8) {
    prx.m_reserved_bits = ON_ParseSettings::FalseSettings.m_reserved_bits;
    prx.m_context_locale_id = ON_ParseSettings::FalseSettings.m_context_locale_id;
    prx.m_context_angle_unit_system = ON_ParseSettings::FalseSettings.m_context_angle_unit_system;
    prx.m_context_length_unit_system = ON_ParseSettings::FalseSettings.m_context_length_unit_system;
    prx.m_reserved = ON_ParseSettings::FalseSettings.m_reserved;
    prx.m_true_default_bits[0] = ON_ParseSettings::FalseSettings.m_true_default_bits[0];
    prx.m_true_default_bits[1] = ON_ParseSettings::FalseSettings.m_true_default_bits[1];
    prx.m_false_default_bits[0] = ON_ParseSettings::FalseSettings.m_false_default_bits[0];
    prx.m_false_default_bits[1] = ON_ParseSettings::FalseSettings.m_false_default_bits[1];
  }
  bVar8 = ON_ParseSettings::ParseError(&pry);
  pOVar13 = local_f0;
  if (!bVar8) {
    pry.m_reserved_bits = ON_ParseSettings::FalseSettings.m_reserved_bits;
    pry.m_context_locale_id = ON_ParseSettings::FalseSettings.m_context_locale_id;
    pry.m_context_angle_unit_system = ON_ParseSettings::FalseSettings.m_context_angle_unit_system;
    pry.m_context_length_unit_system = ON_ParseSettings::FalseSettings.m_context_length_unit_system;
    pry.m_reserved = ON_ParseSettings::FalseSettings.m_reserved;
    pry.m_true_default_bits[0] = ON_ParseSettings::FalseSettings.m_true_default_bits[0];
    pry.m_true_default_bits[1] = ON_ParseSettings::FalseSettings.m_true_default_bits[1];
    pry.m_false_default_bits[0] = ON_ParseSettings::FalseSettings.m_false_default_bits[0];
    pry.m_false_default_bits[1] = ON_ParseSettings::FalseSettings.m_false_default_bits[1];
  }
  bVar8 = ON_ParseSettings::ParseError(&prz);
  if (!bVar8) {
    prz.m_reserved_bits = ON_ParseSettings::FalseSettings.m_reserved_bits;
    prz.m_context_locale_id = ON_ParseSettings::FalseSettings.m_context_locale_id;
    prz.m_context_angle_unit_system = ON_ParseSettings::FalseSettings.m_context_angle_unit_system;
    prz.m_context_length_unit_system = ON_ParseSettings::FalseSettings.m_context_length_unit_system;
    prz.m_reserved = ON_ParseSettings::FalseSettings.m_reserved;
    prz.m_true_default_bits[0] = ON_ParseSettings::FalseSettings.m_true_default_bits[0];
    prz.m_true_default_bits[1] = ON_ParseSettings::FalseSettings.m_true_default_bits[1];
    prz.m_false_default_bits[0] = ON_ParseSettings::FalseSettings.m_false_default_bits[0];
    prz.m_false_default_bits[1] = ON_ParseSettings::FalseSettings.m_false_default_bits[1];
  }
LAB_00574140:
  if (pOVar13 != (ON_ParseSettings *)0x0) {
    operator||(&local_50,&prx,&pry);
    operator||(&local_70,&local_50,&prz);
    pOVar13->m_reserved_bits = local_70.m_reserved_bits;
    pOVar13->m_context_locale_id = local_70.m_context_locale_id;
    pOVar13->m_context_angle_unit_system = local_70.m_context_angle_unit_system;
    pOVar13->m_context_length_unit_system = local_70.m_context_length_unit_system;
    pOVar13->m_reserved = local_70.m_reserved;
    *&pOVar13->m_true_default_bits = local_70.m_true_default_bits;
    *&pOVar13->m_false_default_bits = local_70.m_false_default_bits;
  }
  return local_128;
}

Assistant:

int ON_ParsePointExpression(
  const wchar_t* str,
  int str_count,
  ON_ParseSettings parse_settings,
  ON::LengthUnitSystem point_value_unit_system,
  ON_3dPoint* point_value,
  ON_ParseSettings* parse_results
  )
{
  ON_2dVector cos_sin_a0, cos_sin_a1;
  double x = ON_UNSET_VALUE, y = ON_UNSET_VALUE, z = 0.0;
  double r = ON_UNSET_VALUE, polar_angle = ON_UNSET_VALUE, spherical_angle = ON_UNSET_VALUE;

  if ( point_value )
    *point_value = ON_3dPoint::Origin;
  if ( parse_results)
    *parse_results = ON_ParseSettings::FalseSettings;

  ON_ParseSettings prx(ON_ParseSettings::FalseSettings);
  ON_ParseSettings pry(ON_ParseSettings::FalseSettings);
  ON_ParseSettings prz(ON_ParseSettings::FalseSettings);

  int str_index = 0;

  bool bPolarAngle = false;

  for(;;)
  {
    if ( -1 == str_count )
      str_count = ON_ParseSettings::max_expression_str_count;

    if ( str_count <= 0 )
      break;

    int i0 = 0;
    if ( parse_settings.ParseLeadingWhiteSpace() )
    {
      while ( i0 < str_count && parse_settings.IsLeadingWhiteSpace(str[i0]) )
        i0++;
      if ( i0 >= str_count )
        break;
     parse_settings.SetParseLeadingWhiteSpace(false);
    }

    int i1 = ON_ParseLengthExpression(
      str+i0, str_count-i0,
      parse_settings,
      point_value_unit_system,
      &x,
      &prx,
      0
      );
    if ( i1 < 1)
      break;

    i1 += i0;
    if ( i1 == str_count && i0+1 == i1 && '0' == str[i0] && 0.0 == x )
    {
      // world origin specified as a single zero.
      y = 0.0;
      z = 0.0;
      str_index = i0+i1;
      break;
    }

    if ( i1 >= str_count )
      break;

    if ( i1+2 <= str_count && str[i1] == ',' && str[i1+1] == '<' )
    {
      // It is a common for people to type "d,<a" instead of "d<a"
      // and this clause allows them to do it.
      i1++;
      if ( i1 >= str_count)
        break;
    }

    int i2;
    if ( str[i1] != ',' )
    {
      i1++;
      if ( i1 >= str_count )
        break;
      i2 = ON_ParseLengthExpression(
            str+i1, str_count-i1,
            parse_settings,
            point_value_unit_system,
            &y,
            &pry,
            0
            );
      if ( i2 > 0 && i1+i0 <= str_count && ON_IsValid(x) && ON_IsValid(y) )
      {
        r = ON_2dVector(x,y).Length();
      }
    }
    else if ( str[i1] == '<' )
    {
      bPolarAngle = true;
      r = x;
      x = ON_UNSET_VALUE;
      i1++;
      if ( i1 >= str_count )
        break;
      i2 = ON_ParseAngleExpression(
            str+i1, str_count-i1,
            parse_settings,
            ON::AngleUnitSystem::Radians,
            &polar_angle,
            &pry,
            0
            );
      if ( i2 > 0 && i1+i0 <= str_count && ON_IsValid(polar_angle) && ON_IsValid(r) )
      {
        cos_sin_a0 = CosineAndSine(polar_angle);
        x = r*cos_sin_a0.x;
        y = r*cos_sin_a0.y;
      }
      else
      {
        break;
      }
    }
    else if ( i0+1 == i1 && '0' == str[i0] && 0.0 == x )
    {
      // single 0 for origin
      y = 0.0;
      str_index = i1;
      pry = ON_ParseSettings::FalseSettings;
      break;
    }
    else
    {
      i2 = 0;
    }

    if ( i2 <= 0 )
      break;

    i2 += i1;

    if ( i2 >= str_count )
    {
      // 2d point
      str_index = i2;
      break;
    }

    if ( i2+2 <= str_count && str[i2] == ',' && str[i2+1] == '<' )
    {
      // It is a common for people to type "x,y,<a" instead of "x,y<a"
      // and this clause allows them to do it.
      i2++;
      if ( i2 >= str_count )
        break;
    }

    int i3;
    if ( str[i2] == ',' ) 
    {
      i2++;
      if ( i2 >= str_count )
        break;
      i3 = ON_ParseLengthExpression(
        str+i2, str_count-i2,
        parse_settings,
        point_value_unit_system,
        &z,
        &prz,
        0
        );
    }
    else if (  str[i2] == '<' )
    {
      // spherical angle
      i3 = ON_ParseAngleExpression(
        str+i2, str_count-i2,
        parse_settings,
        ON::AngleUnitSystem::Radians,
        &spherical_angle,
        &prz,
        0
        );
      if ( i3 <= 0 || i2+i3 > str_count )
        break;
      if ( !ON_IsValid(spherical_angle) || !ON_IsValid(r) || !(r >= 0.0) )
        break;
      cos_sin_a1 = CosineAndSine(spherical_angle);
      if ( bPolarAngle )
      {
        // spherical coordinates (r<a<e)
        if ( cos_sin_a1.x >= 0.0 )
        {
          x = r*cos_sin_a1.x; 
          y = r*cos_sin_a1.x;
          z = r*cos_sin_a1.y;
        }
        else
        {
          break;
        }
      }
      else if ( cos_sin_a1.x > 0.0 )
      {
        // elevation (x,y<e)
        double tan_a = tan(spherical_angle);
        if ( ON_IsValid(tan_a) )
          z = r*tan_a;
        else
          break;
      }
      else
      {
        break;
      }
    }
    else
    {
      // 2d point
      str_index = i2;
      break;
    }

    if ( i3 <= 0 )
      break;
    i3 += i2;
    if ( i3 > str_count )
      break;

    str_index = i3;
    break;
  }

  if ( str_index > 0 )
  {
    if ( point_value )
    {
      point_value->x = x;
      point_value->y = y;
      point_value->z = z;
    }
  }
  else
  {
    if ( !prx.ParseError() )
      prx = ON_ParseSettings::FalseSettings;
    if ( !pry.ParseError() )
      pry = ON_ParseSettings::FalseSettings;
    if ( !prz.ParseError() )
      prz = ON_ParseSettings::FalseSettings;
  }

  if ( parse_results )
  {
    *parse_results = (prx || pry || prz);
  }

  return str_index;
}